

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O1

void __thiscall
cinatra::coro_http_connection::
coro_http_connection<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
          (coro_http_connection *this,
          ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
          *executor,socket *socket,coro_http_router *router)

{
  rep rVar1;
  allocator<char> local_82;
  allocator<char> local_81 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  function<void_(const_unsigned_long_&)> *local_70;
  coro_http_response *local_68;
  coro_http_request *local_60;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_58;
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  *local_50;
  streambuf *local_48;
  streambuf *local_40;
  socket *local_38;
  
  (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->executor_ = executor;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                  *)&this->socket_,
                 (io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                  *)socket);
  this->router_ = router;
  local_38 = &this->socket_;
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->head_buf_,0xffffffffffffffff,local_81);
  local_78 = &(this->body_).field_2;
  (this->body_)._M_dataplus._M_p = (pointer)local_78;
  (this->body_)._M_string_length = 0;
  (this->body_).field_2._M_local_buf[0] = '\0';
  local_48 = &this->chunked_buf_;
  local_40 = &this->head_buf_;
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (local_48,0xffffffffffffffff,&local_82);
  (this->parser_).status_ = 0;
  local_58 = &(this->parser_).queries_;
  (this->parser_).msg_._M_len = 0;
  (this->parser_).msg_._M_str = (char *)0x0;
  *(undefined8 *)((long)&(this->parser_).msg_._M_str + 4) = 0;
  *(undefined8 *)((long)&(this->parser_).num_headers_ + 4) = 0;
  *(undefined4 *)((long)&(this->parser_).body_len_ + 7) = 0;
  (this->parser_).body_len_ = 0;
  memset(&(this->parser_).headers_,0,0xcb0);
  (this->parser_).queries_._M_h._M_buckets = &(this->parser_).queries_._M_h._M_single_bucket;
  (this->parser_).queries_._M_h._M_bucket_count = 1;
  (this->parser_).queries_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->parser_).queries_._M_h._M_element_count = 0;
  (this->parser_).queries_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->parser_).queries_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->parser_).queries_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60 = &this->request_;
  (this->request_).params_._M_h._M_buckets = &(this->request_).params_._M_h._M_single_bucket;
  (this->request_).params_._M_h._M_bucket_count = 1;
  (this->request_).params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->request_).params_._M_h._M_element_count = 0;
  (this->request_).params_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->request_).params_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->request_).params_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->request_).matches_.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->request_).matches_.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->request_).matches_.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->request_).matches_._M_begin._M_current = (char *)0x0;
  (this->request_).parser_ = &this->parser_;
  (this->request_).body_._M_len = 0;
  (this->request_).body_._M_str = (char *)0x0;
  (this->request_).conn_ = this;
  (this->request_).is_websocket_ = false;
  (this->request_).aspect_data_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->request_).aspect_data_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->request_).aspect_data_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->request_).cached_session_id_._M_dataplus._M_p =
       (pointer)&(this->request_).cached_session_id_.field_2;
  (this->request_).cached_session_id_._M_string_length = 0;
  (this->request_).cached_session_id_.field_2._M_local_buf[0] = '\0';
  (this->request_).user_data_._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  (this->request_).user_data_._M_storage._M_ptr = (void *)0x0;
  local_68 = &this->response_;
  (this->response_).status_ = not_implemented;
  (this->response_).fmt_type_ = normal;
  (this->response_).content_._M_dataplus._M_p = (pointer)&(this->response_).content_.field_2;
  (this->response_).content_._M_string_length = 0;
  (this->response_).content_.field_2._M_local_buf[0] = '\0';
  *(undefined2 *)
   &(this->response_).keepalive_.super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_engaged = 0;
  (this->response_).resp_headers_.
  super__Vector_base<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->response_).resp_headers_.
  super__Vector_base<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->response_).resp_headers_.
  super__Vector_base<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->response_).resp_header_span_._M_ptr = (pointer)0x0;
  (this->response_).resp_header_span_._M_extent._M_extent_value = 0;
  (this->response_).conn_ = this;
  (this->response_).boundary_._M_dataplus._M_p = (pointer)&(this->response_).boundary_.field_2;
  (this->response_).boundary_._M_string_length = 0;
  (this->response_).boundary_.field_2._M_local_buf[0] = '\0';
  (this->response_).has_set_content_ = false;
  (this->response_).need_shrink_every_time_ = false;
  (this->response_).need_date_ = true;
  (this->response_).cookies_._M_h._M_buckets = &(this->response_).cookies_._M_h._M_single_bucket;
  (this->response_).cookies_._M_h._M_bucket_count = 1;
  (this->response_).cookies_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->response_).cookies_._M_h._M_element_count = 0;
  (this->response_).cookies_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70 = &this->quit_cb_;
  *(undefined8 *)
   ((long)&(this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->buffers_).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->response_).content_view_._M_len = 0;
  (this->response_).content_view_._M_str = (char *)0x0;
  (this->response_).content_type_._M_len = 0;
  (this->response_).content_type_._M_str = (char *)0x0;
  (this->response_).cookies_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->response_).cookies_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->quit_cb_).super__Function_base._M_manager + 1) = 0;
  *(undefined8 *)((long)&(this->quit_cb_)._M_invoker + 1) = 0;
  *(undefined8 *)((long)&(this->quit_cb_).super__Function_base._M_functor + 8) = 0;
  (this->quit_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  this->conn_id_ = 0;
  *(undefined8 *)&(this->quit_cb_).super__Function_base._M_functor = 0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->last_rwtime_)._M_i.__d.__r = rVar1;
  this->max_part_size_ = 0x800000;
  (this->resp_str_)._M_dataplus._M_p = (pointer)&(this->resp_str_).field_2;
  (this->resp_str_)._M_string_length = 0;
  (this->resp_str_).field_2._M_local_buf[0] = '\0';
  (this->ws_).sec_ws_key_._M_len = 0;
  (this->ws_).sec_ws_key_._M_str = (char *)0x0;
  (this->ws_).payload_length_ = 0;
  (this->ws_).left_header_len_ = 2;
  (this->ws_).mask_key_[0] = '\0';
  (this->ws_).mask_key_[1] = '\0';
  (this->ws_).mask_key_[2] = '\0';
  (this->ws_).mask_key_[3] = '\0';
  (this->ws_).msg_opcode_ = '\0';
  (this->ws_).msg_fin_ = '\0';
  (this->ws_).len_bytes_ = SHORT_HEADER;
  this->need_shrink_every_time_ = false;
  this->multi_buf_ = true;
  local_50 = &this->default_handler_;
  *(undefined8 *)&(this->default_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->default_handler_).super__Function_base._M_functor + 8) = 0;
  (this->default_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->default_handler_)._M_invoker = (_Invoker_type)0x0;
  (this->chunk_size_str_)._M_dataplus._M_p = (pointer)&(this->chunk_size_str_).field_2;
  (this->chunk_size_str_)._M_string_length = 0;
  (this->chunk_size_str_).field_2._M_local_buf[0] = '\0';
  (this->remote_addr_)._M_dataplus._M_p = (pointer)&(this->remote_addr_).field_2;
  (this->remote_addr_)._M_string_length = 0;
  (this->remote_addr_).field_2._M_local_buf[0] = '\0';
  this->max_http_body_len_ = 0;
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::reserve(&this->buffers_,3);
  return;
}

Assistant:

coro_http_connection(executor_t *executor, asio::ip::tcp::socket socket,
                       coro_http_router &router)
      : executor_(executor),
        socket_(std::move(socket)),
        router_(router),
        request_(parser_, this),
        response_(this) {
    buffers_.reserve(3);
  }